

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_crc32.c
# Opt level: O2

void csp_crc32_update(csp_crc32_t *crc,void *data,uint32_t length)

{
  long lVar1;
  uint8_t *data8;
  
  if (crc != (csp_crc32_t *)0x0) {
    for (lVar1 = 0; length != (uint32_t)lVar1; lVar1 = lVar1 + 1) {
      *crc = *crc >> 8 ^ crc_tab[(byte)(*(byte *)((long)data + lVar1) ^ (byte)*crc)];
    }
  }
  return;
}

Assistant:

void csp_crc32_update(csp_crc32_t * crc, const void * data, uint32_t length) {

	const uint8_t * data8 = (uint8_t*)data;

	if (crc) {
		while (length--) {
#ifdef __AVR__
			crc = pgm_read_dword(&crc_tab[(crc ^ *data8++) & 0xFFL]) ^ (crc >> 8);
#else
			(*crc) = crc_tab[((*crc) ^ *data8++) & 0xFFL] ^ ((*crc) >> 8);
#endif
		}
	}
}